

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O2

rt_expr<viennamath::rt_expression_interface<double>_> * __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>>::operator=
          (rt_expr<viennamath::rt_expression_interface<double>> *this,ct_constant<8L> *param_1)

{
  auto_ptr_ref<const_viennamath::rt_expression_interface<double>_> __ref;
  
  __ref._M_ptr = (rt_expression_interface<double> *)operator_new(0x10);
  (__ref._M_ptr)->_vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_expression_interface_001177a8;
  __ref._M_ptr[1]._vptr_rt_expression_interface = (_func_int **)0x4020000000000000;
  std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)this,__ref);
  return (rt_expr<viennamath::rt_expression_interface<double>_> *)this;
}

Assistant:

rt_expr & operator=(ct_constant<value> const & /*other*/)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(new rt_constant<numeric_type>(value));
        return *this;
      }